

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::EnumFieldGenerator::DetermineForwardDeclarations
          (EnumFieldGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls)

{
  string *this_00;
  FileDescriptor *pFVar1;
  EnumDescriptor *this_01;
  FileDescriptor *pFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  string *local_20;
  string *name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fwd_decls_local;
  EnumFieldGenerator *this_local;
  
  name = (string *)fwd_decls;
  fwd_decls_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  FieldGenerator::DetermineForwardDeclarations((FieldGenerator *)this,fwd_decls);
  pFVar1 = FieldDescriptor::file
                     ((this->super_SingleFieldGenerator).super_FieldGenerator.descriptor_);
  this_01 = FieldDescriptor::enum_type
                      ((this->super_SingleFieldGenerator).super_FieldGenerator.descriptor_);
  pFVar2 = EnumDescriptor::file(this_01);
  if (pFVar1 != pFVar2) {
    FieldGenerator::variable_abi_cxx11_(&local_40,(FieldGenerator *)this,"storage_type");
    this_00 = name;
    local_20 = &local_40;
    std::operator+(&local_80,"GPB_ENUM_FWD_DECLARE(",&local_40);
    std::operator+(&local_60,&local_80,")");
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void EnumFieldGenerator::DetermineForwardDeclarations(
    set<string>* fwd_decls) const {
  SingleFieldGenerator::DetermineForwardDeclarations(fwd_decls);
  // If it is an enum defined in a different file, then we'll need a forward
  // declaration for it.  When it is in our file, all the enums are output
  // before the message, so it will be declared before it is needed.
  if (descriptor_->file() != descriptor_->enum_type()->file()) {
    // Enum name is already in "storage_type".
    const string& name = variable("storage_type");
    fwd_decls->insert("GPB_ENUM_FWD_DECLARE(" + name + ")");
  }
}